

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdAddPsbtGlobalXpubkey
              (void *handle,void *psbt_handle,char *xpubkey,char *fingerprint,char *bip32_path)

{
  pointer *ppuVar1;
  pointer puVar2;
  bool bVar3;
  NetType NVar4;
  size_t sVar5;
  CfdException *pCVar6;
  string xpub_str;
  KeyData key_data;
  allocator local_3ba;
  allocator local_3b9;
  ByteData local_3b8;
  string local_3a0;
  string local_380;
  string local_360;
  ExtPubkey local_340;
  undefined1 local_2d0 [336];
  KeyData local_180;
  
  cfd::Initialize();
  ppuVar1 = (pointer *)
            ((long)&local_180.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 0x10
            );
  local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)&local_180);
  if ((pointer *)
      local_180.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_180.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  bVar3 = cfd::capi::IsEmptyString(xpubkey);
  if (bVar3) {
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x83c;
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdAddPsbtGlobalXpubkey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_180,kCfdLogLevelWarning,"xpubkey is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"Failed to parameter. xpubkey is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_180);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) == 0) {
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x842;
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdAddPsbtGlobalXpubkey";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_180,kCfdLogLevelWarning,"psbt is null.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)&local_180);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_360,xpubkey,(allocator *)&local_180);
  cfd::core::KeyData::KeyData(&local_180);
  if (local_360._M_string_length == 0x9c) {
    cfd::core::ByteData::ByteData((ByteData *)&local_380,&local_360);
    cfd::core::ExtPubkey::ExtPubkey(&local_340,(ByteData *)&local_380);
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"");
    cfd::core::ByteData::ByteData(&local_3b8);
    cfd::core::KeyData::KeyData((KeyData *)local_2d0,&local_340,&local_3a0,&local_3b8);
    cfd::core::KeyData::operator=(&local_180,(KeyData *)local_2d0);
    cfd::core::KeyData::~KeyData((KeyData *)local_2d0);
    if (local_3b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3b8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    if (local_340.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_340.tweak_sum_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_340.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_340.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_340.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_340.chaincode_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_340.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_340.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_380._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_380._M_dataplus._M_p);
    }
LAB_0041cbd8:
    cfd::core::KeyData::GetExtPubkey((ExtPubkey *)local_2d0,&local_180);
    NVar4 = cfd::core::ExtPubkey::GetNetworkType((ExtPubkey *)local_2d0);
    if ((pointer)local_2d0._88_8_ != (pointer)0x0) {
      operator_delete((void *)local_2d0._88_8_);
    }
    if ((pointer)local_2d0._64_8_ != (pointer)0x0) {
      operator_delete((void *)local_2d0._64_8_);
    }
    if ((pointer)local_2d0._40_8_ != (pointer)0x0) {
      operator_delete((void *)local_2d0._40_8_);
    }
    if ((pointer)local_2d0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_2d0._0_8_);
    }
    if ((*(int *)((long)psbt_handle + 0x10) != 0) == (NVar4 == kMainnet)) {
      local_2d0._0_8_ = "cfdcapi_psbt.cpp";
      local_2d0._8_4_ = 0x85a;
      local_2d0._16_8_ = "CfdAddPsbtGlobalXpubkey";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)local_2d0,kCfdLogLevelWarning,"unmatch xpubkey network type.")
      ;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_2d0._0_8_ = local_2d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d0,"Failed to parameter. unmatch xpubkey network type.","");
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_2d0);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::KeyData::GetBip32Path_abi_cxx11_((string *)local_2d0,&local_180,kApostrophe,false);
    if (CONCAT44(local_2d0._12_4_,local_2d0._8_4_) == 0) {
      bVar3 = true;
    }
    else {
      cfd::core::KeyData::GetFingerprint(&local_340.serialize_data_,&local_180);
      sVar5 = cfd::core::ByteData::GetDataSize(&local_340.serialize_data_);
      bVar3 = sVar5 != 4;
      if (local_340.serialize_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_340.serialize_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    puVar2 = local_2d0 + 0x10;
    if ((pointer)local_2d0._0_8_ != puVar2) {
      operator_delete((void *)local_2d0._0_8_);
    }
    if (bVar3) {
      bVar3 = cfd::capi::IsEmptyString(fingerprint);
      if (bVar3) {
        local_2d0._0_8_ = "cfdcapi_psbt.cpp";
        local_2d0._8_4_ = 0x863;
        local_2d0._16_8_ = "CfdAddPsbtGlobalXpubkey";
        cfd::core::logger::log<>
                  ((CfdSourceLocation *)local_2d0,kCfdLogLevelWarning,
                   "fingerprint is null or empty.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_2d0._0_8_ = puVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2d0,"Failed to parameter. fingerprint is null or empty.","");
        cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_2d0);
        __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      bVar3 = cfd::capi::IsEmptyString(bip32_path);
      if (bVar3) {
        local_2d0._0_8_ = "cfdcapi_psbt.cpp";
        local_2d0._8_4_ = 0x869;
        local_2d0._16_8_ = "CfdAddPsbtGlobalXpubkey";
        cfd::core::logger::log<>
                  ((CfdSourceLocation *)local_2d0,kCfdLogLevelWarning,"bip32_path is null or empty."
                  );
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_2d0._0_8_ = puVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2d0,"Failed to parameter. bip32_path is null or empty.","");
        cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_2d0);
        __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      cfd::core::KeyData::GetExtPubkey(&local_340,&local_180);
      std::__cxx11::string::string((string *)&local_3a0,bip32_path,&local_3b9);
      std::__cxx11::string::string((string *)&local_380,fingerprint,&local_3ba);
      cfd::core::ByteData::ByteData(&local_3b8,&local_380);
      cfd::core::KeyData::KeyData((KeyData *)local_2d0,&local_340,&local_3a0,&local_3b8);
      cfd::core::KeyData::operator=(&local_180,(KeyData *)local_2d0);
      cfd::core::KeyData::~KeyData((KeyData *)local_2d0);
      if (local_3b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3b8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p);
      }
      if (local_340.tweak_sum_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_340.tweak_sum_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_340.pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_340.pubkey_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_340.chaincode_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_340.chaincode_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_340.serialize_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_340.serialize_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    cfd::core::Psbt::SetGlobalXpubkey(*(Psbt **)((long)psbt_handle + 0x18),&local_180);
    cfd::core::KeyData::~KeyData(&local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p);
    }
    return 0;
  }
  cfd::core::KeyData::KeyData((KeyData *)local_2d0,&local_360,-1,false);
  cfd::core::KeyData::operator=(&local_180,(KeyData *)local_2d0);
  cfd::core::KeyData::~KeyData((KeyData *)local_2d0);
  bVar3 = cfd::core::KeyData::HasExtPubkey(&local_180);
  if (bVar3) {
    bVar3 = cfd::core::KeyData::HasExtPrivkey(&local_180);
    if (!bVar3) goto LAB_0041cbd8;
  }
  local_2d0._0_8_ = "cfdcapi_psbt.cpp";
  local_2d0._8_4_ = 0x84f;
  local_2d0._16_8_ = "CfdAddPsbtGlobalXpubkey";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_2d0,kCfdLogLevelWarning,"psbt invalid xpubkey format.");
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  local_2d0._0_8_ = local_2d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,"Failed to parameter. psbt invalid xpubkey format.","");
  cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_2d0);
  __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddPsbtGlobalXpubkey(
    void* handle, void* psbt_handle, const char* xpubkey,
    const char* fingerprint, const char* bip32_path) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(xpubkey)) {
      warn(CFD_LOG_SOURCE, "xpubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. xpubkey is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::string xpub_str(xpubkey);
    KeyData key_data;
    if (xpub_str.length() == kCfdExtPubkeyHexSize) {
      key_data = KeyData(ExtPubkey(ByteData(xpub_str)), "", ByteData());
    } else {
      key_data = KeyData(xpub_str);
      if ((!key_data.HasExtPubkey()) || key_data.HasExtPrivkey()) {
        warn(CFD_LOG_SOURCE, "psbt invalid xpubkey format.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. psbt invalid xpubkey format.");
      }
    }

    bool has_mainnet =
        (key_data.GetExtPubkey().GetNetworkType() == NetType::kMainnet);
    if (((psbt_obj->net_type == NetType::kMainnet) && (!has_mainnet)) ||
        ((psbt_obj->net_type != NetType::kMainnet) && (has_mainnet))) {
      warn(CFD_LOG_SOURCE, "unmatch xpubkey network type.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. unmatch xpubkey network type.");
    }

    if (key_data.GetBip32Path().empty() ||
        (key_data.GetFingerprint().GetDataSize() != 4)) {
      if (IsEmptyString(fingerprint)) {
        warn(CFD_LOG_SOURCE, "fingerprint is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. fingerprint is null or empty.");
      }
      if (IsEmptyString(bip32_path)) {
        warn(CFD_LOG_SOURCE, "bip32_path is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. bip32_path is null or empty.");
      }
      key_data = KeyData(
          key_data.GetExtPubkey(), std::string(bip32_path),
          ByteData(fingerprint));
    }
    psbt_obj->psbt->SetGlobalXpubkey(key_data);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}